

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  byte in_00;
  _Bool _Var1;
  char *pcVar2;
  size_t local_70;
  size_t sStack_60;
  CURLcode result;
  size_t length;
  size_t strindex;
  size_t newlen;
  uchar in;
  char *testing_ptr;
  char *ns;
  size_t alloc;
  byte *pbStack_20;
  int inlength_local;
  char *string_local;
  Curl_easy *data_local;
  
  if (inlength == 0) {
    local_70 = strlen(string);
  }
  else {
    local_70 = (size_t)inlength;
  }
  strindex = local_70 + 1;
  length = 0;
  testing_ptr = (char *)(*Curl_cmalloc)(strindex);
  if (testing_ptr == (char *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    sStack_60 = local_70;
    ns = (char *)strindex;
    pbStack_20 = (byte *)string;
    while (sStack_60 != 0) {
      in_00 = *pbStack_20;
      _Var1 = Curl_isunreserved(in_00);
      if (_Var1) {
        testing_ptr[length] = in_00;
        length = length + 1;
      }
      else {
        strindex = strindex + 2;
        pcVar2 = testing_ptr;
        if (ns < strindex) {
          ns = (char *)((long)ns << 1);
          pcVar2 = (char *)(*Curl_crealloc)(testing_ptr,(size_t)ns);
          if (pcVar2 == (char *)0x0) {
            (*Curl_cfree)(testing_ptr);
            return (char *)0x0;
          }
        }
        testing_ptr = pcVar2;
        curl_msnprintf(testing_ptr + length,4,"%%%02X",(ulong)in_00);
        length = length + 3;
      }
      pbStack_20 = pbStack_20 + 1;
      sStack_60 = sStack_60 - 1;
    }
    testing_ptr[length] = '\0';
    data_local = (Curl_easy *)testing_ptr;
  }
  return (char *)data_local;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t alloc = (inlength?(size_t)inlength:strlen(string))+1;
  char *ns;
  char *testing_ptr = NULL;
  unsigned char in; /* we need to treat the characters unsigned */
  size_t newlen = alloc;
  size_t strindex=0;
  size_t length;
  CURLcode result;

  ns = malloc(alloc);
  if(!ns)
    return NULL;

  length = alloc-1;
  while(length--) {
    in = *string;

    if(Curl_isunreserved(in))
      /* just copy this */
      ns[strindex++]=in;
    else {
      /* encode it */
      newlen += 2; /* the size grows with two, since this'll become a %XX */
      if(newlen > alloc) {
        alloc *= 2;
        testing_ptr = realloc(ns, alloc);
        if(!testing_ptr) {
          free(ns);
          return NULL;
        }
        else {
          ns = testing_ptr;
        }
      }

      result = Curl_convert_to_network(data, &in, 1);
      if(result) {
        /* Curl_convert_to_network calls failf if unsuccessful */
        free(ns);
        return NULL;
      }

      snprintf(&ns[strindex], 4, "%%%02X", in);

      strindex+=3;
    }
    string++;
  }
  ns[strindex]=0; /* terminate it */
  return ns;
}